

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::pair<int,int>>::emplace_back<int&,int&>
          (SmallVectorBase<std::pair<int,_int>_> *this,int *args,int *args_1)

{
  iterator this_00;
  int *in_RDX;
  int *in_RSI;
  SmallVectorBase<std::pair<int,_int>_> *in_RDI;
  int *in_stack_00000028;
  int *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<std::pair<int,_int>_> *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::pair<int,_int>_>::end(in_RDI);
    local_8 = emplaceRealloc<int&,int&>
                        (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  else {
    this_00 = SmallVectorBase<std::pair<int,_int>_>::end(in_RDI);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(this_00,in_RSI,in_RDX);
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::pair<int,_int>_>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }